

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

void spvtools::val::anon_unknown_0::ComputeMemberConstraintsForStruct
               (MemberConstraints *constraints,uint32_t struct_id,LayoutConstraints *inherited,
               ValidationState_t *vstate)

{
  ushort uVar1;
  _Rb_tree_color _Var2;
  uint32_t uVar3;
  Instruction *pIVar4;
  ulong uVar5;
  mapped_type *pmVar6;
  const_iterator cVar7;
  ulong uVar8;
  FieldDecorationsIter FVar9;
  key_type local_50;
  void *local_48;
  long lStack_40;
  long local_38;
  
  if (constraints == (MemberConstraints *)0x0) {
    __assert_fail("constraints",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x410,
                  "void spvtools::val::(anonymous namespace)::ComputeMemberConstraintsForStruct(MemberConstraints *, uint32_t, const LayoutConstraints &, ValidationState_t &)"
                 );
  }
  pIVar4 = ValidationState_t::FindDef(vstate,struct_id);
  local_48 = (void *)0x0;
  lStack_40 = 0;
  local_38 = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
             (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,
             (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  uVar5 = (ulong)(lStack_40 - (long)local_48) >> 2;
  if ((int)uVar5 != 0) {
    uVar8 = 0;
    do {
      local_50 = (key_type)((uVar8 << 0x20) + (ulong)struct_id);
      pmVar6 = std::
               unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
               ::operator[](constraints,&local_50);
      uVar3 = inherited->matrix_stride;
      pmVar6->majorness = inherited->majorness;
      pmVar6->matrix_stride = uVar3;
      FVar9 = ValidationState_t::id_member_decorations(vstate,struct_id,(uint32_t)uVar8);
      for (cVar7 = FVar9.begin._M_node; cVar7._M_node != FVar9.end._M_node._M_node;
          cVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar7._M_node)) {
        if (uVar8 != cVar7._M_node[2]._M_color) {
          __assert_fail("decoration->struct_member_index() == (int)memberIdx",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                        ,0x41b,
                        "void spvtools::val::(anonymous namespace)::ComputeMemberConstraintsForStruct(MemberConstraints *, uint32_t, const LayoutConstraints &, ValidationState_t &)"
                       );
        }
        _Var2 = cVar7._M_node[1]._M_color;
        if (_Var2 == 7) {
          pmVar6->matrix_stride = (cVar7._M_node[1]._M_parent)->_M_color;
        }
        else if (_Var2 == 5) {
          pmVar6->majorness = kColumnMajor;
        }
        else if (_Var2 == 4) {
          pmVar6->majorness = kRowMajor;
        }
      }
      uVar3 = *(uint32_t *)((long)local_48 + uVar8 * 4);
      pIVar4 = ValidationState_t::FindDef(vstate,uVar3);
      uVar1 = (pIVar4->inst_).opcode;
      if (uVar1 - 0x1c < 2) {
        ComputeMemberConstraintsForArray(constraints,uVar3,inherited,vstate);
      }
      else if (uVar1 == 0x1e) {
        ComputeMemberConstraintsForStruct(constraints,uVar3,inherited,vstate);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar5 & 0xffffffff));
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void ComputeMemberConstraintsForStruct(MemberConstraints* constraints,
                                       uint32_t struct_id,
                                       const LayoutConstraints& inherited,
                                       ValidationState_t& vstate) {
  assert(constraints);
  const auto& members = getStructMembers(struct_id, vstate);
  for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
       memberIdx < numMembers; memberIdx++) {
    LayoutConstraints& constraint =
        (*constraints)[std::make_pair(struct_id, memberIdx)];
    constraint = inherited;
    auto member_decorations =
        vstate.id_member_decorations(struct_id, memberIdx);
    for (auto decoration = member_decorations.begin;
         decoration != member_decorations.end; ++decoration) {
      assert(decoration->struct_member_index() == (int)memberIdx);
      switch (decoration->dec_type()) {
        case spv::Decoration::RowMajor:
          constraint.majorness = kRowMajor;
          break;
        case spv::Decoration::ColMajor:
          constraint.majorness = kColumnMajor;
          break;
        case spv::Decoration::MatrixStride:
          constraint.matrix_stride = decoration->params()[0];
          break;
        default:
          break;
      }
    }

    // Now recurse
    auto member_type_id = members[memberIdx];
    const auto member_type_inst = vstate.FindDef(member_type_id);
    const auto opcode = member_type_inst->opcode();
    switch (opcode) {
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
        ComputeMemberConstraintsForArray(constraints, member_type_id, inherited,
                                         vstate);
        break;
      case spv::Op::OpTypeStruct:
        ComputeMemberConstraintsForStruct(constraints, member_type_id,
                                          inherited, vstate);
        break;
      default:
        break;
    }
  }
}